

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *jp2,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                          opj_event_mgr_t *p_manager)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  OPJ_UINT32 l_value;
  uint local_54;
  opj_event_mgr_t *local_50;
  opj_jp2_t *local_48;
  uint local_3c;
  int local_38;
  OPJ_UINT32 local_34;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0xa8a,
                  "OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0xa8b,
                  "OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0xa8c,
                  "OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((jp2->jp2_state & 2) == 0) {
    pcVar4 = "The  box must be the first box in the file.\n";
  }
  else {
    jp2->jp2_img_state = 0;
    if (p_header_size != 0) {
      iVar3 = 0;
      local_50 = p_manager;
      local_48 = jp2;
      do {
        if (p_header_size < 8) {
          pcVar4 = "Cannot handle box of less than 8 bytes\n";
LAB_0011e99d:
          p_manager = local_50;
          opj_event_msg(local_50,1,pcVar4);
          pcVar4 = "Stream error while reading JP2 Header box\n";
          goto LAB_0011e9bd;
        }
        local_38 = iVar3;
        opj_read_bytes_LE(p_header_data,&local_54,4);
        uVar7 = local_54;
        opj_read_bytes_LE(p_header_data + 4,&local_54,4);
        uVar1 = local_54;
        if (uVar7 == 1) {
          if (p_header_size < 0x10) {
            pcVar4 = "Cannot handle XL box of less than 16 bytes\n";
          }
          else {
            opj_read_bytes_LE(p_header_data + 8,&local_34,4);
            if (local_34 == 0) {
              opj_read_bytes_LE(p_header_data + 0xc,&local_54,4);
              if (local_54 == 0) goto LAB_0011e96b;
              uVar2 = 0x10;
              uVar7 = local_54;
              goto LAB_0011e8a6;
            }
            pcVar4 = "Cannot handle box sizes higher than 2^32\n";
          }
          goto LAB_0011e99d;
        }
        uVar2 = 8;
        if (uVar7 == 0) {
LAB_0011e96b:
          pcVar4 = "Cannot handle box of undefined sizes\n";
          goto LAB_0011e99d;
        }
LAB_0011e8a6:
        uVar6 = uVar7 - uVar2;
        if (uVar7 < uVar2) {
          pcVar4 = "Box length is inconsistent.\n";
          goto LAB_0011e99d;
        }
        if (p_header_size < uVar7) {
          pcVar4 = "Stream error while reading JP2 Header box: box length is inconsistent.\n";
          p_manager = local_50;
          goto LAB_0011e9bd;
        }
        lVar5 = 8;
        do {
          local_3c = p_header_size;
          if (*(uint *)((long)&jp2_header[2].handler + lVar5) == uVar1) {
            uVar6 = uVar7 - uVar2;
            iVar3 = (**(code **)((long)&jp2_img_header[0].id + lVar5))
                              (local_48,p_header_data + uVar2,uVar6,local_50);
            if (iVar3 == 0) {
              return 0;
            }
            goto LAB_0011e90b;
          }
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x68);
        local_48->jp2_img_state = local_48->jp2_img_state | 0x7fffffff;
LAB_0011e90b:
        iVar3 = local_38;
        if (uVar1 == 0x69686472) {
          iVar3 = 1;
        }
        p_header_data = p_header_data + (ulong)uVar6 + (ulong)uVar2;
        p_header_size = local_3c - uVar7;
      } while (p_header_size != 0);
      p_manager = local_50;
      if (iVar3 != 0) {
        *(byte *)&local_48->jp2_state = (byte)local_48->jp2_state | 4;
        local_48->has_jp2h = '\x01';
        return 1;
      }
    }
    pcVar4 = "Stream error while reading JP2 Header box: no \'ihdr\' box.\n";
  }
LAB_0011e9bd:
  opj_event_msg(p_manager,1,pcVar4);
  return 0;
}

Assistant:

static OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *jp2,
                                  OPJ_BYTE *p_header_data,
                                  OPJ_UINT32 p_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    OPJ_UINT32 l_box_size = 0, l_current_data_size = 0;
    opj_jp2_box_t box;
    const opj_jp2_header_handler_t * l_current_handler;
    OPJ_BOOL l_has_ihdr = 0;

    /* preconditions */
    assert(p_header_data != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);

    /* make sure the box is well placed */
    if ((jp2->jp2_state & JP2_STATE_FILE_TYPE) != JP2_STATE_FILE_TYPE) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "The  box must be the first box in the file.\n");
        return OPJ_FALSE;
    }

    jp2->jp2_img_state = JP2_IMG_STATE_NONE;

    /* iterate while remaining data */
    while (p_header_size > 0) {

        if (! opj_jp2_read_boxhdr_char(&box, p_header_data, &l_box_size, p_header_size,
                                       p_manager)) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Stream error while reading JP2 Header box\n");
            return OPJ_FALSE;
        }

        if (box.length > p_header_size) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Stream error while reading JP2 Header box: box length is inconsistent.\n");
            return OPJ_FALSE;
        }

        l_current_handler = opj_jp2_img_find_handler(box.type);
        l_current_data_size = box.length - l_box_size;
        p_header_data += l_box_size;

        if (l_current_handler != 00) {
            if (! l_current_handler->handler(jp2, p_header_data, l_current_data_size,
                                             p_manager)) {
                return OPJ_FALSE;
            }
        } else {
            jp2->jp2_img_state |= JP2_IMG_STATE_UNKNOWN;
        }

        if (box.type == JP2_IHDR) {
            l_has_ihdr = 1;
        }

        p_header_data += l_current_data_size;
        p_header_size -= box.length;
    }

    if (l_has_ihdr == 0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Stream error while reading JP2 Header box: no 'ihdr' box.\n");
        return OPJ_FALSE;
    }

    jp2->jp2_state |= JP2_STATE_HEADER;
    jp2->has_jp2h = 1;

    return OPJ_TRUE;
}